

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

PktIn * pq_in_after(PacketQueueBase *pqb,PacketQueueNode *prev,_Bool pop)

{
  PacketQueueBase *node;
  PktIn *pPVar1;
  
  node = (PacketQueueBase *)prev->next;
  if (node == pqb) {
    pPVar1 = (PktIn *)0x0;
  }
  else {
    if (pop) {
      pq_unlink_common(pqb,(PacketQueueNode *)node);
      (node->end).prev = pktin_freeq_head.prev;
      (node->end).next = &pktin_freeq_head;
      pktin_freeq_head.prev = (PacketQueueNode *)node;
      ((node->end).prev)->next = (PacketQueueNode *)node;
      (node->end).on_free_queue = true;
      queue_idempotent_callback(&ic_pktin_free);
    }
    pPVar1 = (PktIn *)&node[-1].total_size;
  }
  return pPVar1;
}

Assistant:

static PktIn *pq_in_after(PacketQueueBase *pqb,
                          PacketQueueNode *prev, bool pop)
{
    PacketQueueNode *node = prev->next;
    if (node == &pqb->end)
        return NULL;

    if (pop) {
        pq_unlink_common(pqb, node);

        node->prev = pktin_freeq_head.prev;
        node->next = &pktin_freeq_head;
        node->next->prev = node;
        node->prev->next = node;
        node->on_free_queue = true;

        queue_idempotent_callback(&ic_pktin_free);
    }

    return container_of(node, PktIn, qnode);
}